

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * sqlite3CreateColumnExpr(sqlite3 *db,SrcList *pSrc,int iSrc,int iCol)

{
  Bitmask *pBVar1;
  Table *pTVar2;
  Expr *pEVar3;
  int iVar4;
  
  pEVar3 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
  if (pEVar3 != (Expr *)0x0) {
    pEVar3->op = '\0';
    pEVar3->affinity = '\0';
    *(undefined2 *)&pEVar3->field_0x2 = 0;
    pEVar3->flags = 0;
    (pEVar3->u).zToken = (char *)0x0;
    pEVar3->iColumn = 0;
    pEVar3->iAgg = 0;
    pEVar3->iRightJoinTable = 0;
    pEVar3->op2 = '\0';
    pEVar3->field_0x37 = 0;
    pEVar3->pAggInfo = (AggInfo *)0x0;
    (pEVar3->x).pList = (ExprList *)0x0;
    pEVar3->nHeight = 0;
    pEVar3->iTable = 0;
    pEVar3->pLeft = (Expr *)0x0;
    pEVar3->pRight = (Expr *)0x0;
    (pEVar3->y).pTab = (Table *)0x0;
    pEVar3->op = 0xa2;
    pEVar3->iAgg = -1;
    pEVar3->nHeight = 1;
    pTVar2 = pSrc->a[iSrc].pTab;
    (pEVar3->y).pTab = pTVar2;
    pEVar3->iTable = pSrc->a[iSrc].iCursor;
    if (pTVar2->iPKey == iCol) {
      pEVar3->iColumn = -1;
    }
    else {
      iVar4 = 0x3f;
      if (iCol < 0x3f) {
        iVar4 = iCol;
      }
      pEVar3->iColumn = (ynVar)iCol;
      pBVar1 = &pSrc->a[iSrc].colUsed;
      *pBVar1 = *pBVar1 | 1L << ((byte)iVar4 & 0x3f);
    }
  }
  return pEVar3;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3CreateColumnExpr(sqlite3 *db, SrcList *pSrc, int iSrc, int iCol){
  Expr *p = sqlite3ExprAlloc(db, TK_COLUMN, 0, 0);
  if( p ){
    struct SrcList_item *pItem = &pSrc->a[iSrc];
    p->y.pTab = pItem->pTab;
    p->iTable = pItem->iCursor;
    if( p->y.pTab->iPKey==iCol ){
      p->iColumn = -1;
    }else{
      p->iColumn = (ynVar)iCol;
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      pItem->colUsed |= ((Bitmask)1)<<(iCol>=BMS ? BMS-1 : iCol);
    }
  }
  return p;
}